

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGeneratorTarget.cxx
# Opt level: O0

void __thiscall cmTargetTraceDependencies::Trace(cmTargetTraceDependencies *this)

{
  string_view arg;
  cmValue this_00;
  bool bVar1;
  reference ppcVar2;
  mapped_type *pmVar3;
  string *psVar4;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *names;
  cmCustomCommand *cc_00;
  cmCustomCommand *cc;
  string *local_a0;
  string *objDep;
  iterator __end3;
  iterator __begin3;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  *__range3;
  undefined1 local_70 [8];
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  objDeps;
  allocator<char> local_41;
  string local_40;
  cmValue local_20;
  cmValue additionalDeps;
  cmSourceFile *sf;
  cmTargetTraceDependencies *this_local;
  
  while (bVar1 = std::
                 queue<cmSourceFile_*,_std::deque<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>
                 ::empty(&this->SourceQueue), ((bVar1 ^ 0xffU) & 1) != 0) {
    ppcVar2 = std::
              queue<cmSourceFile_*,_std::deque<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>::
              front(&this->SourceQueue);
    additionalDeps.Value = (string *)*ppcVar2;
    std::queue<cmSourceFile_*,_std::deque<cmSourceFile_*,_std::allocator<cmSourceFile_*>_>_>::pop
              (&this->SourceQueue);
    pmVar3 = std::
             map<const_cmSourceFile_*,_cmGeneratorTarget::SourceEntry,_std::less<const_cmSourceFile_*>,_std::allocator<std::pair<const_cmSourceFile_*const,_cmGeneratorTarget::SourceEntry>_>_>
             ::operator[](&this->GeneratorTarget->SourceDepends,(key_type *)&additionalDeps);
    this_00 = additionalDeps;
    this->CurrentEntry = pmVar3;
    std::allocator<char>::allocator();
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_40,"OBJECT_DEPENDS",&local_41);
    local_20 = cmSourceFile::GetProperty(this_00.Value,&local_40);
    std::__cxx11::string::~string((string *)&local_40);
    std::allocator<char>::~allocator(&local_41);
    bVar1 = cmValue::operator_cast_to_bool(&local_20);
    if (bVar1) {
      psVar4 = cmValue::operator*[abi_cxx11_(&local_20);
      arg = (string_view)std::__cxx11::string::operator_cast_to_basic_string_view((string *)psVar4);
      cmExpandedList_abi_cxx11_
                ((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                  *)local_70,arg,false);
      __end3 = std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::begin((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_70);
      objDep = (string *)
               std::
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               ::end((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)local_70);
      while (bVar1 = __gnu_cxx::operator!=
                               (&__end3,(__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                                         *)&objDep), bVar1) {
        local_a0 = __gnu_cxx::
                   __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::operator*(&__end3);
        bVar1 = cmsys::SystemTools::FileIsFullPath(local_a0);
        if (bVar1) {
          cmsys::SystemTools::CollapseFullPath((string *)&cc,local_a0);
          std::__cxx11::string::operator=((string *)local_a0,(string *)&cc);
          std::__cxx11::string::~string((string *)&cc);
        }
        __gnu_cxx::
        __normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
        ::operator++(&__end3);
      }
      FollowNames(this,(vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_70);
      std::
      vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                 *)local_70);
    }
    psVar4 = cmSourceFile::ResolveFullPath(additionalDeps.Value,(string *)0x0,(string *)0x0);
    FollowName(this,psVar4);
    names = cmSourceFile::GetDepends_abi_cxx11_((cmSourceFile *)additionalDeps.Value);
    FollowNames(this,names);
    cc_00 = cmSourceFile::GetCustomCommand((cmSourceFile *)additionalDeps.Value);
    if (cc_00 != (cmCustomCommand *)0x0) {
      CheckCustomCommand(this,cc_00);
    }
  }
  this->CurrentEntry = (SourceEntry *)0x0;
  cmGeneratorTarget::AddTracedSources(this->GeneratorTarget,&this->NewSources);
  return;
}

Assistant:

void cmTargetTraceDependencies::Trace()
{
  // Process one dependency at a time until the queue is empty.
  while (!this->SourceQueue.empty()) {
    // Get the next source from the queue.
    cmSourceFile* sf = this->SourceQueue.front();
    this->SourceQueue.pop();
    this->CurrentEntry = &this->GeneratorTarget->SourceDepends[sf];

    // Queue dependencies added explicitly by the user.
    if (cmValue additionalDeps = sf->GetProperty("OBJECT_DEPENDS")) {
      std::vector<std::string> objDeps = cmExpandedList(*additionalDeps);
      for (std::string& objDep : objDeps) {
        if (cmSystemTools::FileIsFullPath(objDep)) {
          objDep = cmSystemTools::CollapseFullPath(objDep);
        }
      }
      this->FollowNames(objDeps);
    }

    // Queue the source needed to generate this file, if any.
    this->FollowName(sf->ResolveFullPath());

    // Queue dependencies added programmatically by commands.
    this->FollowNames(sf->GetDepends());

    // Queue custom command dependencies.
    if (cmCustomCommand const* cc = sf->GetCustomCommand()) {
      this->CheckCustomCommand(*cc);
    }
  }
  this->CurrentEntry = nullptr;

  this->GeneratorTarget->AddTracedSources(this->NewSources);
}